

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

sysbvm_tuple_t sysbvm_scanner_scan(sysbvm_context_t *context,sysbvm_tuple_t sourceCode)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  undefined1 local_70 [8];
  sysbvm_scannerState_t scannerState;
  sysbvm_sourceCode_t *sourceCodeObject;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_4aef7a3d gcFrame;
  sysbvm_tuple_t sourceCode_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x10);
  memset(&sourceCodeObject,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourceCodeObject);
  sysbvm_gc_lock(context);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_orderedCollection_create(context);
  _Var1 = sysbvm_tuple_isNonNullPointer(sourceCode);
  if ((_Var1) &&
     (scannerState.position = sourceCode,
     _Var1 = sysbvm_tuple_isBytes(*(sysbvm_tuple_t *)(sourceCode + 0x10)), _Var1)) {
    scannerState.sourceCode = *(long *)(scannerState.position + 0x10) + 0x10;
    local_70 = (undefined1  [8])sourceCode;
    scannerState.text =
         (uint8_t *)sysbvm_tuple_getSizeInBytes(*(sysbvm_tuple_t *)(scannerState.position + 0x10));
    scannerState.size = 0;
    do {
      if (scannerState.text <= scannerState.size) break;
      _Var1 = sysbvm_scanner_scanNextTokenInto
                        (context,(sysbvm_scannerState_t *)local_70,
                         (sysbvm_tuple_t)gcFrameRecord.roots);
    } while (_Var1);
  }
  sVar2 = sysbvm_orderedCollection_asArraySlice(context,(sysbvm_tuple_t)gcFrameRecord.roots);
  sysbvm_gc_unlock(context);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourceCodeObject);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_scanner_scan(sysbvm_context_t *context, sysbvm_tuple_t sourceCode)
{
    struct {
        sysbvm_tuple_t tokenList;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_gc_lock(context);

    gcFrame.tokenList = sysbvm_orderedCollection_create(context);

    if(sysbvm_tuple_isNonNullPointer(sourceCode))
    {
        sysbvm_sourceCode_t *sourceCodeObject = (sysbvm_sourceCode_t*)sourceCode;
        if(sysbvm_tuple_isBytes(sourceCodeObject->text))
        {
            sysbvm_scannerState_t scannerState = {
                .sourceCode = sourceCode,
                .text = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(sourceCodeObject->text)->bytes,
                .size = sysbvm_tuple_getSizeInBytes(sourceCodeObject->text),
                .position = 0
            };

            while(scannerState.position < scannerState.size)
            {
                if(!sysbvm_scanner_scanNextTokenInto(context, &scannerState, gcFrame.tokenList))
                    break;
            }
        }
    }

    gcFrame.result = sysbvm_orderedCollection_asArraySlice(context, gcFrame.tokenList);
    sysbvm_gc_unlock(context);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}